

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mediator_unittests.cc
# Opt level: O0

void __thiscall
cpp_mediator_send_receive_Test::~cpp_mediator_send_receive_Test
          (cpp_mediator_send_receive_Test *this)

{
  cpp_mediator_send_receive_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(cpp_mediator, send_receive) {
  AHandler1 a1{};
  AHandler2 a2{};
  BHandler b{};

  // None of these should compile!:
  // 
  // auto m = holden::make_mediator(); // error: no handler for `GetA` exists
  // m.send(GetA{});
  // 
  // auto m = holden::make_mediator(b); // error: no handler for `GetA` exists
  // m.send(GetA{});
  // 
  // auto m = holden::make_mediator(a1, a2, b); // error: more than one handler 
  // m.send(GetA{});                            //  for a given request
  // 
  // auto m = holden::make_mediator(a1, a1, b); // error: more than one handler 
  // m.send(GetA{});                            //  for a given request
  // 

  {
    auto m = holden::make_mediator(b);
    auto b_res = m.send(GetB{});
    ASSERT_EQ(3, b_res);
  }

  {
    auto m = holden::make_mediator(a1, b);
    auto a_res =  m.send(GetA{});
    ASSERT_EQ(1, a_res);
    auto b_res = m.send(GetB{});
    ASSERT_EQ(3, b_res);
  }

  {
    auto m = holden::make_mediator(a2, b);
    auto a_res =  m.send(GetA{});
    ASSERT_EQ(2, a_res);
    auto b_res = m.send(GetB{});
    ASSERT_EQ(3, b_res);
  }
}